

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O1

bool __thiscall
cmSourceFileLocation::MatchesAmbiguousExtension
          (cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  cmake *this_00;
  ulong uVar5;
  string_view ext;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0x8b,
                  "bool cmSourceFileLocation::MatchesAmbiguousExtension(const cmSourceFileLocation &) const"
                 );
  }
  uVar1 = (this->Name)._M_string_length;
  uVar5 = (loc->Name)._M_string_length;
  if (uVar1 == uVar5) {
    if (uVar1 == 0) {
      return true;
    }
    iVar4 = bcmp((this->Name)._M_dataplus._M_p,(loc->Name)._M_dataplus._M_p,uVar1);
    if (iVar4 == 0) {
      return true;
    }
  }
  if ((uVar5 < uVar1) &&
     (local_38._M_str = (this->Name)._M_dataplus._M_p, local_38._M_str[uVar5] == '.')) {
    bVar3 = false;
    __str._M_str = (loc->Name)._M_dataplus._M_p;
    __str._M_len = uVar5;
    local_38._M_len = uVar1;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_38,0,uVar5,__str);
    if (iVar4 == 0) {
      uVar1 = (this->Name)._M_string_length;
      uVar5 = (loc->Name)._M_string_length + 1;
      if (uVar1 < uVar5) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar5);
      }
      pcVar2 = (this->Name)._M_dataplus._M_p;
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      ext._M_str = pcVar2 + uVar5;
      ext._M_len = uVar1 - uVar5;
      bVar3 = cmake::IsAKnownExtension(this_00,ext);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmSourceFileLocation::MatchesAmbiguousExtension(
  cmSourceFileLocation const& loc) const
{
  assert(this->Makefile);
  // This location's extension is not ambiguous but loc's extension
  // is.  See if the names match as-is.
  if (this->Name == loc.Name) {
    return true;
  }

  // Check if loc's name could possibly be extended to our name by
  // adding an extension.
  if (!(this->Name.size() > loc.Name.size() &&
        this->Name[loc.Name.size()] == '.' &&
        cmHasPrefix(this->Name, loc.Name))) {
    return false;
  }

  // Only a fixed set of extensions will be tried to match a file on
  // disk.  One of these must match if loc refers to this source file.
  auto ext = cm::string_view(this->Name).substr(loc.Name.size() + 1);
  cmMakefile const* mf = this->Makefile;
  auto* cm = mf->GetCMakeInstance();
  return cm->IsAKnownExtension(ext);
}